

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

TypedExpectation<cv::Mat_(cv::Mat,_cv::Rect_<int>)> * __thiscall
testing::internal::MockSpec<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::InternalExpectedAt
          (MockSpec<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *this,char *file,int line,char *obj,
          char *call)

{
  size_type *psVar1;
  long *plVar2;
  TypedExpectation<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *pTVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 local_70 [8];
  string source_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"EXPECT_CALL(","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_b0);
  local_90 = &local_80;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar1 = &__str._M_string_length;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    __str._M_string_length = *psVar5;
    __str.field_2._M_allocated_capacity = plVar2[3];
    source_text.field_2._8_8_ = psVar1;
  }
  else {
    __str._M_string_length = *psVar5;
    source_text.field_2._8_8_ = (size_type *)*plVar2;
  }
  __str._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(source_text.field_2._M_local_buf + 8);
  local_70 = (undefined1  [8])&source_text._M_string_length;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    source_text._M_string_length = *psVar5;
    source_text.field_2._M_allocated_capacity = plVar2[3];
  }
  else {
    source_text._M_string_length = *psVar5;
    local_70 = (undefined1  [8])*plVar2;
  }
  source_text._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((size_type *)source_text.field_2._8_8_ != psVar1) {
    operator_delete((void *)source_text.field_2._8_8_,__str._M_string_length + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  source_text.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&source_text.field_2 + 8),local_70,
             source_text._M_dataplus._M_p + (long)local_70);
  std::__cxx11::string::append(source_text.field_2._M_local_buf + 8);
  LogWithLocation(kInfo,file,line,(string *)((long)&source_text.field_2 + 8));
  if ((size_type *)source_text.field_2._8_8_ != psVar1) {
    operator_delete((void *)source_text.field_2._8_8_,__str._M_string_length + 1);
  }
  pTVar3 = FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::AddNewExpectation
                     (this->function_mocker_,file,line,(string *)local_70,&this->matchers_);
  if (local_70 != (undefined1  [8])&source_text._M_string_length) {
    operator_delete((void *)local_70,source_text._M_string_length + 1);
  }
  return pTVar3;
}

Assistant:

internal::TypedExpectation<F>& InternalExpectedAt(
      const char* file, int line, const char* obj, const char* call) {
    const string source_text(string("EXPECT_CALL(") + obj + ", " + call + ")");
    LogWithLocation(internal::kInfo, file, line, source_text + " invoked");
    return function_mocker_->AddNewExpectation(
        file, line, source_text, matchers_);
  }